

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::BeginImplFrameArgs::~BeginImplFrameArgs(BeginImplFrameArgs *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__BeginImplFrameArgs_00407e28;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  std::
  unique_ptr<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs>_>
  ::~unique_ptr(&(this->timestamps_in_us_).ptr_);
  std::
  unique_ptr<perfetto::protos::gen::BeginFrameArgs,_std::default_delete<perfetto::protos::gen::BeginFrameArgs>_>
  ::~unique_ptr(&(this->last_args_).ptr_);
  std::
  unique_ptr<perfetto::protos::gen::BeginFrameArgs,_std::default_delete<perfetto::protos::gen::BeginFrameArgs>_>
  ::~unique_ptr(&(this->current_args_).ptr_);
  return;
}

Assistant:

BeginImplFrameArgs::~BeginImplFrameArgs() = default;